

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_context.h
# Opt level: O0

void __thiscall spvtools::opt::IRContext::BuildLivenessManager(IRContext *this)

{
  Analysis AVar1;
  IRContext *local_20;
  unique_ptr<spvtools::opt::analysis::LivenessManager,_std::default_delete<spvtools::opt::analysis::LivenessManager>_>
  local_18;
  IRContext *local_10;
  IRContext *this_local;
  
  local_20 = this;
  local_10 = this;
  MakeUnique<spvtools::opt::analysis::LivenessManager,spvtools::opt::IRContext*>
            ((spvtools *)&local_18,&local_20);
  std::
  unique_ptr<spvtools::opt::analysis::LivenessManager,_std::default_delete<spvtools::opt::analysis::LivenessManager>_>
  ::operator=(&this->liveness_mgr_,&local_18);
  std::
  unique_ptr<spvtools::opt::analysis::LivenessManager,_std::default_delete<spvtools::opt::analysis::LivenessManager>_>
  ::~unique_ptr(&local_18);
  AVar1 = opt::operator|(this->valid_analyses_,kAnalysisLiveness);
  this->valid_analyses_ = AVar1;
  return;
}

Assistant:

void BuildLivenessManager() {
    liveness_mgr_ = MakeUnique<analysis::LivenessManager>(this);
    valid_analyses_ = valid_analyses_ | kAnalysisLiveness;
  }